

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

int traversethread(global_State *g,lua_State *th)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  int iVar8;
  StkId pTVar9;
  StkId lim;
  StkId o;
  UpVal *uv;
  lua_State *th_local;
  global_State *g_local;
  
  lim = th->stack;
  if ((1 < (th->marked & 7)) || (g->gcstate == '\0')) {
    if (9 < (th->tt & 0xf)) {
      __assert_fail("(((th)->tt) & 0x0F) < (9+1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                    ,0x2ce,"int traversethread(global_State *, lua_State *)");
    }
    linkgclist_((GCObject *)th,&th->gclist,&g->grayagain);
  }
  if (lim == (StkId)0x0) {
    g_local._4_4_ = 1;
  }
  else {
    if (((g->gcstate != '\x02') && (th->openupval != (UpVal *)0x0)) && (th->twups == th)) {
      __assert_fail("g->gcstate == 2 || th->openupval == ((void*)0) || (th->twups != th)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                    ,0x2d2,"int traversethread(global_State *, lua_State *)");
    }
    for (; lim < th->top; lim = lim + 1) {
      if ((lim->tt_ & 0x8000) != 0) {
        if ((lim->tt_ & 0x8000) == 0) {
          __assert_fail("(((o)->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                        ,0x2d4,"int traversethread(global_State *, lua_State *)");
        }
        if ((lim->tt_ & 0x7f) != (ushort)((lim->value_).gc)->tt) {
LAB_0012c368:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                        ,0x2d4,"int traversethread(global_State *, lua_State *)");
        }
        if (g->mainthread != (lua_State *)0x0) {
          if ((lim->tt_ & 0x8000) == 0) {
            __assert_fail("(((o)->tt_) & (1 << 15))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                          ,0x2d4,"int traversethread(global_State *, lua_State *)");
          }
          if ((((lim->value_).gc)->marked & (g->mainthread->l_G->currentwhite ^ 0x18)) != 0)
          goto LAB_0012c368;
        }
      }
      if ((lim->tt_ & 0x8000) != 0) {
        if ((lim->tt_ & 0x8000) == 0) {
          __assert_fail("(((o)->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                        ,0x2d4,"int traversethread(global_State *, lua_State *)");
        }
        if ((((lim->value_).gc)->marked & 0x18) != 0) {
          if ((lim->tt_ & 0x8000) == 0) {
            __assert_fail("(((o)->tt_) & (1 << 15))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                          ,0x2d4,"int traversethread(global_State *, lua_State *)");
          }
          reallymarkobject(g,(lim->value_).gc);
        }
      }
    }
    for (o = (StkId)th->openupval; o != (StkId)0x0; o = (StkId)o[1].value_.gc) {
      uVar1._0_1_ = ((o->value_).gc)->tt;
      uVar1._1_1_ = ((o->value_).gc)->marked;
      if ((uVar1 & 0x8000) != 0) {
        uVar2._0_1_ = ((o->value_).gc)->tt;
        uVar2._1_1_ = ((o->value_).gc)->marked;
        uVar3._0_1_ = ((o->value_).gc)->tt;
        uVar3._1_1_ = ((o->value_).gc)->marked;
        if ((uVar3 & 0x8000) == 0) {
          __assert_fail("(((uv->v)->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                        ,0x2d6,"int traversethread(global_State *, lua_State *)");
        }
        if ((uVar2 & 0x7f) != (ushort)((o->value_).gc)->next->tt) {
LAB_0012c53e:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                        ,0x2d6,"int traversethread(global_State *, lua_State *)");
        }
        if (g->mainthread != (lua_State *)0x0) {
          uVar4._0_1_ = ((o->value_).gc)->tt;
          uVar4._1_1_ = ((o->value_).gc)->marked;
          if ((uVar4 & 0x8000) == 0) {
            __assert_fail("(((uv->v)->tt_) & (1 << 15))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                          ,0x2d6,"int traversethread(global_State *, lua_State *)");
          }
          if ((((o->value_).gc)->next->marked & (g->mainthread->l_G->currentwhite ^ 0x18)) != 0)
          goto LAB_0012c53e;
        }
      }
      uVar5._0_1_ = ((o->value_).gc)->tt;
      uVar5._1_1_ = ((o->value_).gc)->marked;
      if ((uVar5 & 0x8000) != 0) {
        uVar6._0_1_ = ((o->value_).gc)->tt;
        uVar6._1_1_ = ((o->value_).gc)->marked;
        if ((uVar6 & 0x8000) == 0) {
          __assert_fail("(((uv->v)->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                        ,0x2d6,"int traversethread(global_State *, lua_State *)");
        }
        if ((((o->value_).gc)->next->marked & 0x18) != 0) {
          uVar7._0_1_ = ((o->value_).gc)->tt;
          uVar7._1_1_ = ((o->value_).gc)->marked;
          if ((uVar7 & 0x8000) == 0) {
            __assert_fail("(((uv->v)->tt_) & (1 << 15))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                          ,0x2d6,"int traversethread(global_State *, lua_State *)");
          }
          reallymarkobject(g,((o->value_).gc)->next);
        }
      }
    }
    if (g->gcstate == '\x02') {
      if (g->gcemergency == '\0') {
        luaD_shrinkstack(th);
      }
      pTVar9 = th->stack;
      iVar8 = th->stacksize;
      for (lim = th->top; lim < pTVar9 + iVar8; lim = lim + 1) {
        lim->tt_ = 0;
      }
      if ((th->twups == th) && (th->openupval != (UpVal *)0x0)) {
        th->twups = g->twups;
        g->twups = th;
      }
    }
    g_local._4_4_ = th->stacksize + 1;
  }
  return g_local._4_4_;
}

Assistant:

static int traversethread (global_State *g, lua_State *th) {
  UpVal *uv;
  StkId o = th->stack;
  if (isold(th) || g->gcstate == GCSpropagate)
    linkgclist(th, g->grayagain);  /* insert into 'grayagain' list */
  if (o == NULL)
    return 1;  /* stack not completely built yet */
  lua_assert(g->gcstate == GCSatomic ||
             th->openupval == NULL || isintwups(th));
  for (; o < th->top; o++)  /* mark live elements in the stack */
    markvalue(g, o);
  for (uv = th->openupval; uv != NULL; uv = uv->u.open.next)
    markvalue(g, uv->v);  /* open upvalues cannot be collected */
  if (g->gcstate == GCSatomic) {  /* final traversal? */
    if (!g->gcemergency)
      luaD_shrinkstack(th); /* do not change stack in emergency cycle */  
    StkId lim = th->stack + th->stacksize;  /* real end of stack */
    for (o = th->top; o < lim; o++)  /* clear not-marked stack slice */
      setnilvalue(o);
    /* 'remarkupvals' may have removed thread from 'twups' list */
    if (!isintwups(th) && th->openupval != NULL) {
      th->twups = g->twups;  /* link it back to the list */
      g->twups = th;
    }
  }
  return 1 + th->stacksize;
}